

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

void __thiscall QWidget::releaseKeyboard(QWidget *this)

{
  QWindow *pQVar1;
  
  if (keyboardGrb != this) {
    return;
  }
  pQVar1 = grabberWindow(this);
  if (pQVar1 != (QWindow *)0x0) {
    QWindow::setKeyboardGrabEnabled(SUB81(pQVar1,0));
  }
  keyboardGrb = (QWidget *)0x0;
  return;
}

Assistant:

void QWidget::releaseKeyboard()
{
    if (keyboardGrb == this) {
        if (QWindow *window = grabberWindow(this))
            window->setKeyboardGrabEnabled(false);
        keyboardGrb = nullptr;
    }
}